

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,_long_long>::emplace_helper<long_long>
          (QHash<QString,_long_long> *this,QString *key,longlong *args)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  ulong uVar6;
  piter pVar7;
  long lVar8;
  longlong lVar9;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_long_long>_>::findOrInsert<QString>
            ((InsertionResult *)local_38,this->d,key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    uVar6 = (ulong)bVar1;
    lVar8 = uVar6 * 0x20;
    pDVar3 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)pEVar2[uVar6].storage.data = pDVar3;
    pcVar4 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    *(char16_t **)(pEVar2[uVar6].storage.data + 8) = pcVar4;
    qVar5 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(pEVar2[uVar6].storage.data + 0x10) = qVar5;
    lVar9 = *args;
  }
  else {
    lVar9 = *args;
    lVar8 = (ulong)bVar1 << 5;
  }
  *(longlong *)((pEVar2->storage).data + lVar8 + 0x18) = lVar9;
  pVar7.bucket = local_38._8_8_;
  pVar7.d = (Data<QHashPrivate::Node<QString,_long_long>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar7;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }